

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int next_cache_entry(archive_read *a,iso9660 *iso9660,file_info **pfile)

{
  heap_queue *heap;
  int *piVar1;
  anon_struct_16_2_ec647c9d_for_cache_files *paVar2;
  anon_struct_16_2_ec647c9d_for_re_files *paVar3;
  anon_struct_16_2_ec647c9d_for_rede_files *paVar4;
  file_info ***pppfVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  uint64_t uVar9;
  file_info *pfVar10;
  void *pvVar11;
  ulong uVar12;
  uint64_t uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  undefined8 uVar18;
  file_info *pfVar19;
  byte *isodirrec;
  file_info *pfVar20;
  content *pcVar21;
  size_t sVar22;
  void *pvVar23;
  file_info ***pppfVar24;
  byte bVar25;
  byte *pbVar26;
  uchar *p;
  char *fmt;
  char cVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  file_info *pfVar33;
  int iVar34;
  ulong uVar35;
  size_t min;
  int iVar36;
  bool bVar37;
  anon_struct_16_2_ec647c9d empty_files;
  uint local_84;
  ulong local_80;
  file_info *local_70;
  file_info *local_58;
  file_info **ppfStack_50;
  heap_queue *local_48;
  long local_40;
  size_t local_38;
  
  paVar2 = &iso9660->cache_files;
  pfVar19 = (iso9660->cache_files).first;
  if (pfVar19 != (file_info *)0x0) {
    pfVar20 = pfVar19->next;
    paVar2->first = pfVar20;
    if (pfVar20 == (file_info *)0x0) {
      (iso9660->cache_files).last = &paVar2->first;
    }
    if (pfVar19 != (file_info *)0x0) {
      *pfile = pfVar19;
      return 0;
    }
  }
  heap = &iso9660->pending_files;
  paVar3 = &iso9660->re_files;
  do {
    pfVar19 = heap_get_entry(heap);
    *pfile = pfVar19;
    if (pfVar19 == (file_info *)0x0) {
      if (((paVar3->first != (file_info *)0x0) &&
          (pfVar19 = iso9660->rr_moved, pfVar19 != (file_info *)0x0)) &&
         (pfVar19->rr_moved_has_re_only != '\0')) {
        pfVar19->next = (file_info *)0x0;
        *(iso9660->cache_files).last = pfVar19;
        (iso9660->cache_files).last = &pfVar19->next;
      }
LAB_001491c5:
      pfVar19 = paVar3->first;
      if (pfVar19 != (file_info *)0x0) {
        pfVar20 = pfVar19->re_next;
        paVar3->first = pfVar20;
        if (pfVar20 == (file_info *)0x0) {
          (iso9660->re_files).last = &paVar3->first;
        }
        if (pfVar19 == (file_info *)0x0) goto LAB_001491ea;
        pfVar20 = (pfVar19->rede_files).first;
        bVar37 = pfVar20 == (file_info *)0x0;
        if (!bVar37) {
          paVar4 = &pfVar19->rede_files;
          do {
            pfVar10 = pfVar20->re_next;
            paVar4->first = pfVar10;
            if (pfVar10 == (file_info *)0x0) {
              (pfVar19->rede_files).last = &paVar4->first;
            }
            if (bVar37) break;
            pfVar20->next = (file_info *)0x0;
            *(iso9660->cache_files).last = pfVar20;
            (iso9660->cache_files).last = &pfVar20->next;
            pfVar20 = paVar4->first;
            bVar37 = pfVar20 == (file_info *)0x0;
          } while (!bVar37);
        }
        goto LAB_001491c5;
      }
LAB_001491ea:
      cVar27 = '\x01';
      if (paVar2->first == (file_info *)0x0) {
        local_84 = 1;
      }
      else {
        local_84 = next_cache_entry(a,iso9660,pfile);
      }
      pfVar19 = (file_info *)0x0;
    }
    else {
      uVar9 = pfVar19->cl_offset;
      if (uVar9 == 0) {
        if ((pfVar19->mode & 0xf000) != 0x4000) goto LAB_001493eb;
        pvVar11 = a->format->data;
        if (*(long *)((long)pvVar11 + 0xe0) != 0) {
          __archive_read_consume(a,*(long *)((long)pvVar11 + 0xe0));
          *(undefined8 *)((long)pvVar11 + 0xe0) = 0;
        }
        uVar35 = *(ulong *)((long)pvVar11 + 0xa0);
        uVar12 = pfVar19->offset;
        if (uVar12 < uVar35) {
          archive_set_error(&a->archive,-1,"Ignoring out-of-order directory (%s) %jd > %jd",
                            (pfVar19->name).s);
LAB_0014942d:
          local_80 = 0xffffffec;
        }
        else {
          local_80 = pfVar19->size + uVar12;
          if (*(ulong *)((long)pvVar11 + 0xb0) < local_80) {
            archive_set_error(&a->archive,-1,"Directory is beyond end-of-media: %s",
                              (pfVar19->name).s);
            goto LAB_0014942d;
          }
          if (uVar12 < uVar35 || uVar12 - uVar35 == 0) {
LAB_0014949d:
            uVar35 = (pfVar19->size + *(ulong *)((long)pvVar11 + 0xa8)) - 1;
            min = uVar35 - uVar35 % *(ulong *)((long)pvVar11 + 0xa8);
            isodirrec = (byte *)__archive_read_ahead(a,min,(ssize_t *)0x0);
            if (isodirrec == (byte *)0x0) {
              archive_set_error(&a->archive,-1,
                                "Failed to read full block when scanning ISO9660 directory list");
LAB_0014995e:
              local_80 = 0xffffffe2;
            }
            else {
              *(long *)((long)pvVar11 + 0xa0) = *(long *)((long)pvVar11 + 0xa0) + min;
              if (min != 0) {
                local_48 = (heap_queue *)((long)pvVar11 + 0x70);
                local_70 = (file_info *)0x0;
                sVar22 = min;
                do {
                  local_38 = sVar22;
                  local_40 = *(long *)((long)pvVar11 + 0xa8);
                  pbVar26 = isodirrec + *(long *)((long)pvVar11 + 0xa8);
                  bVar25 = *isodirrec;
                  for (; ((bVar25 != 0 && (isodirrec + 0x21 < pbVar26)) &&
                         (isodirrec + bVar25 <= pbVar26)); isodirrec = isodirrec + *isodirrec) {
                    if ((isodirrec[0x20] != 1) || (iVar36 = 6, 1 < isodirrec[0x21])) {
                      pfVar20 = parse_file_info(a,pfVar19,isodirrec,(long)pbVar26 - (long)isodirrec)
                      ;
                      if (pfVar20 == (file_info *)0x0) {
                        __archive_read_consume(a,min);
LAB_001495f4:
                        local_80 = 0xffffffe2;
                        iVar36 = 1;
                      }
                      else {
                        if ((pfVar20->cl_offset == 0) &&
                           ((iVar36 = pfVar20->multi_extent, iVar36 != 0 ||
                            (local_70 != (file_info *)0x0)))) {
                          if (local_70 == (file_info *)0x0) {
                            (pfVar20->contents).first = (content *)0x0;
                            (pfVar20->contents).last = &(pfVar20->contents).first;
                            local_70 = pfVar20;
                          }
                          pcVar21 = (content *)malloc(0x18);
                          if (pcVar21 == (content *)0x0) {
                            bVar37 = false;
                            archive_set_error(&a->archive,0xc,"No memory for multi extent");
                            __archive_read_consume(a,min);
                            local_80 = 0xffffffe2;
                          }
                          else {
                            uVar9 = pfVar20->offset;
                            pcVar21->offset = uVar9;
                            uVar13 = pfVar20->size;
                            pcVar21->size = uVar13;
                            pcVar21->next = (content *)0x0;
                            *(local_70->contents).last = pcVar21;
                            (local_70->contents).last = &pcVar21->next;
                            if (local_70 == pfVar20) {
                              iVar36 = heap_add_entry(a,local_48,pfVar20,uVar9);
                              bVar37 = iVar36 == 0;
                              local_80 = local_80 & 0xffffffff;
                              if (!bVar37) {
                                local_80 = 0xffffffe2;
                              }
                            }
                            else {
                              local_70->size = local_70->size + uVar13;
                              if (iVar36 == 0) {
                                local_70 = (file_info *)0x0;
                              }
                              bVar37 = true;
                            }
                          }
                          iVar36 = 1;
                          if (!bVar37) goto LAB_00149724;
                        }
                        else {
                          iVar36 = heap_add_entry(a,local_48,pfVar20,pfVar20->offset);
                          if (iVar36 != 0) goto LAB_001495f4;
                        }
                        iVar36 = 0;
                      }
                    }
LAB_00149724:
                    if ((iVar36 != 6) && (iVar36 != 0)) goto LAB_00149432;
                    bVar25 = isodirrec[*isodirrec];
                  }
                  sVar22 = local_38 - local_40;
                  isodirrec = pbVar26;
                } while (sVar22 != 0);
              }
              __archive_read_consume(a,min);
              local_80 = 0;
              if (*(int *)((long)pvVar11 + 0x40) != 0) {
                uVar35 = *(ulong *)((long)pvVar11 + 0xa8);
                do {
                  if (**(long **)((long)pvVar11 + 0x38) != *(long *)((long)pvVar11 + 0xa0)) break;
                  pvVar23 = __archive_read_ahead(a,uVar35,(ssize_t *)0x0);
                  if (pvVar23 == (void *)0x0) {
                    iVar36 = -1;
                    fmt = "Failed to read full block when scanning ISO9660 directory list";
LAB_001499ee:
                    archive_set_error(&a->archive,iVar36,fmt);
                    goto LAB_0014995e;
                  }
                  do {
                    puVar14 = *(undefined8 **)((long)pvVar11 + 0x38);
                    pfVar20 = (file_info *)puVar14[1];
                    uVar7 = pfVar20->ce_offset;
                    uVar8 = pfVar20->ce_size;
                    if (uVar35 < uVar8 + uVar7) {
                      iVar36 = 0x54;
                      fmt = "Malformed CE information";
                      goto LAB_001499ee;
                    }
                    if (0 < *(int *)((long)pvVar11 + 0x40)) {
                      uVar29 = *(int *)((long)pvVar11 + 0x40) - 1;
                      *(uint *)((long)pvVar11 + 0x40) = uVar29;
                      uVar18 = (puVar14 + (ulong)uVar29 * 2)[1];
                      *puVar14 = puVar14[(ulong)uVar29 * 2];
                      puVar14[1] = uVar18;
                      iVar36 = *(int *)((long)pvVar11 + 0x40);
                      if (1 < iVar36) {
                        uVar12 = **(ulong **)((long)pvVar11 + 0x38);
                        iVar32 = 0;
                        iVar31 = 1;
                        iVar34 = 0;
                        do {
                          lVar16 = *(long *)((long)pvVar11 + 0x38);
                          uVar28 = *(ulong *)(lVar16 + (long)iVar31 * 0x10);
                          iVar32 = iVar32 + 2;
                          iVar30 = iVar31;
                          if ((iVar32 < iVar36) &&
                             (uVar15 = *(ulong *)(lVar16 + (long)iVar32 * 0x10), uVar15 < uVar28)) {
                            uVar28 = uVar15;
                            iVar30 = iVar32;
                          }
                          if (uVar12 <= uVar28) break;
                          puVar14 = (undefined8 *)(lVar16 + (long)iVar34 * 0x10);
                          local_58 = (file_info *)*puVar14;
                          ppfStack_50 = (file_info **)puVar14[1];
                          iVar31 = iVar30 * 2 + 1;
                          puVar14 = (undefined8 *)(lVar16 + (long)iVar30 * 0x10);
                          uVar18 = puVar14[1];
                          puVar6 = (undefined8 *)(lVar16 + (long)iVar34 * 0x10);
                          *puVar6 = *puVar14;
                          puVar6[1] = uVar18;
                          puVar14 = (undefined8 *)
                                    (*(long *)((long)pvVar11 + 0x38) + (long)iVar30 * 0x10);
                          *puVar14 = local_58;
                          puVar14[1] = ppfStack_50;
                          iVar32 = iVar30 * 2;
                          iVar36 = *(int *)((long)pvVar11 + 0x40);
                          iVar34 = iVar30;
                        } while (iVar31 < iVar36);
                      }
                    }
                    p = (uchar *)((ulong)uVar7 + (long)pvVar23);
                    iVar36 = parse_rockridge(a,pfVar20,p,p + uVar8);
                    if (iVar36 != 0) goto LAB_0014995e;
                  } while ((*(int *)((long)pvVar11 + 0x40) != 0) &&
                          (**(long **)((long)pvVar11 + 0x38) == *(long *)((long)pvVar11 + 0xa0)));
                  __archive_read_consume(a,uVar35);
                  *(long *)((long)pvVar11 + 0xa0) = *(long *)((long)pvVar11 + 0xa0) + uVar35;
                } while (*(int *)((long)pvVar11 + 0x40) != 0);
                local_80 = 0;
              }
            }
          }
          else {
            local_80 = __archive_read_consume(a,uVar12 - uVar35);
            if (-1 < (long)local_80) {
              *(uint64_t *)((long)pvVar11 + 0xa0) = pfVar19->offset;
              goto LAB_0014949d;
            }
          }
        }
LAB_00149432:
        if ((uint)local_80 == 0) {
          if (pfVar19->rr_moved == '\0') {
            if (pfVar19->re != '\0') {
              pfVar19->re_next = (file_info *)0x0;
              *(iso9660->re_files).last = pfVar19;
              (iso9660->re_files).last = &pfVar19->re_next;
              goto LAB_0014992a;
            }
            pfVar20 = pfVar19;
            if (pfVar19->re_descendant != '\0') {
              do {
                pfVar20 = pfVar20->parent;
                if (pfVar20 == (file_info *)0x0) goto LAB_00149467;
              } while (pfVar20->re == '\0');
              pfVar19->re_next = (file_info *)0x0;
              *(pfVar20->rede_files).last = pfVar19;
              (pfVar20->rede_files).last = &pfVar19->re_next;
              if (pfVar20 != (file_info *)0x0) {
                bVar37 = false;
                cVar27 = '\x03';
                goto LAB_00149931;
              }
            }
          }
          else if (pfVar19->rr_moved_has_re_only != '\0') {
LAB_0014992a:
            cVar27 = '\x03';
            bVar37 = false;
            goto LAB_00149931;
          }
LAB_00149467:
          cVar27 = '\0';
          bVar37 = true;
        }
        else {
          cVar27 = '\x01';
          bVar37 = false;
          local_84 = (uint)local_80;
        }
LAB_00149931:
        if (!bVar37) goto LAB_001493f0;
      }
      else {
        pfVar20 = (file_info *)0x0;
        while( true ) {
          pfVar10 = paVar3->first;
          if ((pfVar10 != (file_info *)0x0) &&
             (pfVar33 = pfVar10->re_next, paVar3->first = pfVar33, pfVar33 == (file_info *)0x0)) {
            (iso9660->re_files).last = &paVar3->first;
          }
          bVar25 = 1;
          if (pfVar10 == pfVar20) goto LAB_001493dd;
          if (pfVar10->offset == uVar9) break;
          if (pfVar20 == (file_info *)0x0) {
            pfVar20 = pfVar10;
          }
          pfVar10->re_next = (file_info *)0x0;
          *(iso9660->re_files).last = pfVar10;
          (iso9660->re_files).last = &pfVar10->re_next;
        }
        piVar1 = &pfVar10->parent->subdirs;
        *piVar1 = *piVar1 + -1;
        pfVar20 = pfVar19->parent;
        pfVar10->parent = pfVar20;
        pfVar10->re = '\0';
        if (pfVar20->re_descendant == '\0') {
          *pfile = pfVar10;
          pfVar20 = (pfVar10->rede_files).first;
          bVar37 = pfVar20 == (file_info *)0x0;
          pfVar19 = pfVar10;
          if (!bVar37) {
            paVar4 = &pfVar10->rede_files;
            do {
              pfVar33 = pfVar20->re_next;
              paVar4->first = pfVar33;
              if (pfVar33 == (file_info *)0x0) {
                (pfVar10->rede_files).last = &paVar4->first;
              }
              if (bVar37) break;
              pfVar20->next = (file_info *)0x0;
              *(iso9660->cache_files).last = pfVar20;
              (iso9660->cache_files).last = &pfVar20->next;
              pfVar20 = paVar4->first;
              bVar37 = pfVar20 == (file_info *)0x0;
            } while (!bVar37);
          }
LAB_001493dd:
          cVar27 = (bVar25 ^ 1) * '\x03';
        }
        else {
          pfVar10->re_descendant = '\x01';
          pfVar20 = pfVar10;
          do {
            pfVar20 = pfVar20->parent;
            cVar27 = '\n';
            if (pfVar20 == (file_info *)0x0) goto LAB_00149379;
          } while (pfVar20->re == '\0');
          pfVar10->re_next = (file_info *)0x0;
          *(pfVar20->rede_files).last = pfVar10;
          (pfVar20->rede_files).last = &pfVar10->re_next;
          if (pfVar20 == (file_info *)0x0) {
LAB_00149379:
            bVar25 = 0;
          }
          else {
            paVar4 = &pfVar10->rede_files;
            do {
              pfVar20 = paVar4->first;
              if (pfVar20 == (file_info *)0x0) {
LAB_001499cc:
                bVar25 = 0;
                goto LAB_001493dd;
              }
              pfVar33 = pfVar20->re_next;
              paVar4->first = pfVar33;
              if (pfVar33 == (file_info *)0x0) {
                (pfVar10->rede_files).last = &paVar4->first;
              }
              pfVar33 = pfVar20;
              if (pfVar20 == (file_info *)0x0) goto LAB_001499cc;
              do {
                pfVar33 = pfVar33->parent;
                if (pfVar33 == (file_info *)0x0) goto LAB_00149379;
              } while (pfVar33->re == '\0');
              bVar25 = 0;
              pfVar20->re_next = (file_info *)0x0;
              *(pfVar33->rede_files).last = pfVar20;
              (pfVar33->rede_files).last = &pfVar20->re_next;
            } while (pfVar33 != (file_info *)0x0);
          }
        }
        if (bVar25 == 0) goto LAB_001493f0;
      }
LAB_001493eb:
      cVar27 = '\x02';
    }
LAB_001493f0:
  } while (cVar27 == '\x03');
  if (cVar27 == '\n') {
    archive_set_error(&a->archive,-1,
                      "Failed to connect \'CL\' pointer to \'RE\' rr_moved pointer of Rockridge extensions: current position = %jd, CL offset = %jd"
                      ,iso9660->current_position,pfVar19->cl_offset);
    local_84 = 0xffffffe2;
  }
  else if (((cVar27 == '\x02') && (local_84 = 0, (pfVar19->mode & 0xf000) == 0x8000)) &&
          (lVar16 = pfVar19->number, lVar16 != -1)) {
    iVar36 = 0;
    (iso9660->cache_files).first = (file_info *)0x0;
    pppfVar5 = &(iso9660->cache_files).last;
    (iso9660->cache_files).last = &paVar2->first;
    local_58 = (file_info *)0x0;
    ppfStack_50 = &local_58;
    if (0 < (iso9660->pending_files).used) {
      iVar36 = 0;
      do {
        lVar17 = (*heap->files)->number;
        if ((lVar17 != -1) && (lVar17 != lVar16)) break;
        bVar37 = pfVar19->number != -1;
        pppfVar24 = pppfVar5;
        if (!bVar37) {
          pppfVar24 = &ppfStack_50;
        }
        iVar36 = iVar36 + (uint)bVar37;
        pfVar19->next = (file_info *)0x0;
        **pppfVar24 = pfVar19;
        *pppfVar24 = &pfVar19->next;
        pfVar19 = heap_get_entry(heap);
      } while (0 < (iso9660->pending_files).used);
    }
    if (iVar36 == 0) {
      *pfile = pfVar19;
      local_84 = (uint)(pfVar19 == (file_info *)0x0);
    }
    else {
      bVar37 = pfVar19->number != -1;
      pppfVar24 = &ppfStack_50;
      if (bVar37) {
        pppfVar24 = pppfVar5;
      }
      iVar36 = iVar36 + (uint)bVar37;
      pfVar19->next = (file_info *)0x0;
      **pppfVar24 = pfVar19;
      *pppfVar24 = &pfVar19->next;
      if (1 < iVar36) {
        for (pfVar19 = paVar2->first; pfVar19 != (file_info *)0x0; pfVar19 = pfVar19->next) {
          pfVar19->nlinks = iVar36;
        }
      }
      if (local_58 != (file_info *)0x0) {
        **pppfVar5 = local_58;
        *pppfVar5 = ppfStack_50;
      }
      pfVar19 = paVar2->first;
      if ((pfVar19 != (file_info *)0x0) &&
         (pfVar20 = pfVar19->next, paVar2->first = pfVar20, pfVar20 == (file_info *)0x0)) {
        *pppfVar5 = &paVar2->first;
      }
      local_84 = (uint)(pfVar19 == (file_info *)0x0);
      *pfile = pfVar19;
    }
  }
  return local_84;
}

Assistant:

static int
next_cache_entry(struct archive_read *a, struct iso9660 *iso9660,
    struct file_info **pfile)
{
	struct file_info *file;
	struct {
		struct file_info	*first;
		struct file_info	**last;
	}	empty_files;
	int64_t number;
	int count;

	file = cache_get_entry(iso9660);
	if (file != NULL) {
		*pfile = file;
		return (ARCHIVE_OK);
	}

	for (;;) {
		struct file_info *re, *d;

		*pfile = file = next_entry(iso9660);
		if (file == NULL) {
			/*
			 * If directory entries all which are descendant of
			 * rr_moved are still remaining, expose their.
			 */
			if (iso9660->re_files.first != NULL &&
			    iso9660->rr_moved != NULL &&
			    iso9660->rr_moved->rr_moved_has_re_only)
				/* Expose "rr_moved" entry. */
				cache_add_entry(iso9660, iso9660->rr_moved);
			while ((re = re_get_entry(iso9660)) != NULL) {
				/* Expose its descendant dirs. */
				while ((d = rede_get_entry(re)) != NULL)
					cache_add_entry(iso9660, d);
			}
			if (iso9660->cache_files.first != NULL)
				return (next_cache_entry(a, iso9660, pfile));
			return (ARCHIVE_EOF);
		}

		if (file->cl_offset) {
			struct file_info *first_re = NULL;
			int nexted_re = 0;

			/*
			 * Find "RE" dir for the current file, which
			 * has "CL" flag.
			 */
			while ((re = re_get_entry(iso9660))
			    != first_re) {
				if (first_re == NULL)
					first_re = re;
				if (re->offset == file->cl_offset) {
					re->parent->subdirs--;
					re->parent = file->parent;
					re->re = 0;
					if (re->parent->re_descendant) {
						nexted_re = 1;
						re->re_descendant = 1;
						if (rede_add_entry(re) < 0)
							goto fatal_rr;
						/* Move a list of descendants
						 * to a new ancestor. */
						while ((d = rede_get_entry(
						    re)) != NULL)
							if (rede_add_entry(d)
							    < 0)
								goto fatal_rr;
						break;
					}
					/* Replace the current file
					 * with "RE" dir */
					*pfile = file = re;
					/* Expose its descendant */
					while ((d = rede_get_entry(
					    file)) != NULL)
						cache_add_entry(
						    iso9660, d);
					break;
				} else
					re_add_entry(iso9660, re);
			}
			if (nexted_re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				continue;
			}
		} else if ((file->mode & AE_IFMT) == AE_IFDIR) {
			int r;

			/* Read file entries in this dir. */
			r = read_children(a, file);
			if (r != ARCHIVE_OK)
				return (r);

			/*
			 * Handle a special dir of Rockridge extensions,
			 * "rr_moved".
			 */
			if (file->rr_moved) {
				/*
				 * If this has only the subdirectories which
				 * have "RE" flags, do not expose at this time.
				 */
				if (file->rr_moved_has_re_only)
					continue;
				/* Otherwise expose "rr_moved" entry. */
			} else if (file->re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				re_add_entry(iso9660, file);
				continue;
			} else if (file->re_descendant) {
				/*
				 * If the top level "RE" entry of this entry
				 * is not exposed, we, accordingly, should not
				 * expose this entry at this time because
				 * we cannot make its proper full-path name.
				 */
				if (rede_add_entry(file) == 0)
					continue;
				/* Otherwise we can expose this entry because
				 * it seems its top level "RE" has already been
				 * exposed. */
			}
		}
		break;
	}

	if ((file->mode & AE_IFMT) != AE_IFREG || file->number == -1)
		return (ARCHIVE_OK);

	count = 0;
	number = file->number;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	empty_files.first = NULL;
	empty_files.last = &empty_files.first;
	/* Collect files which has the same file serial number.
	 * Peek pending_files so that file which number is different
	 * is not put back. */
	while (iso9660->pending_files.used > 0 &&
	    (iso9660->pending_files.files[0]->number == -1 ||
	     iso9660->pending_files.files[0]->number == number)) {
		if (file->number == -1) {
			/* This file has the same offset
			 * but it's wrong offset which empty files
			 * and symlink files have.
			 * NOTE: This wrong offset was recorded by
			 * old mkisofs utility. If ISO images is
			 * created by latest mkisofs, this does not
			 * happen.
			 */
			file->next = NULL;
			*empty_files.last = file;
			empty_files.last = &(file->next);
		} else {
			count++;
			cache_add_entry(iso9660, file);
		}
		file = next_entry(iso9660);
	}

	if (count == 0) {
		*pfile = file;
		return ((file == NULL)?ARCHIVE_EOF:ARCHIVE_OK);
	}
	if (file->number == -1) {
		file->next = NULL;
		*empty_files.last = file;
		empty_files.last = &(file->next);
	} else {
		count++;
		cache_add_entry(iso9660, file);
	}

	if (count > 1) {
		/* The count is the same as number of hardlink,
		 * so much so that each nlinks of files in cache_file
		 * is overwritten by value of the count.
		 */
		for (file = iso9660->cache_files.first;
		    file != NULL; file = file->next)
			file->nlinks = count;
	}
	/* If there are empty files, that files are added
	 * to the tail of the cache_files. */
	if (empty_files.first != NULL) {
		*iso9660->cache_files.last = empty_files.first;
		iso9660->cache_files.last = empty_files.last;
	}
	*pfile = cache_get_entry(iso9660);
	return ((*pfile == NULL)?ARCHIVE_EOF:ARCHIVE_OK);

fatal_rr:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Failed to connect 'CL' pointer to 'RE' rr_moved pointer of "
	    "Rockridge extensions: current position = %jd, CL offset = %jd",
	    (intmax_t)iso9660->current_position, (intmax_t)file->cl_offset);
	return (ARCHIVE_FATAL);
}